

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp analyze_macro_once(sexp ctx,sexp x,sexp op,int depth)

{
  sexp psVar1;
  sexp ctx_00;
  long lVar2;
  sexp tmp;
  sexp local_38;
  sexp_gc_var_t local_30;
  
  local_30.var = &local_38;
  local_38 = (sexp)0x43e;
  local_30.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  local_38 = sexp_cons_op(ctx,(sexp)0x0,2,(op->value).type.cpl,(sexp)&DAT_0000023e);
  local_38 = sexp_cons_op(ctx,(sexp)0x0,2,(ctx->value).type.cpl,local_38);
  ctx_00 = sexp_cons_op(ctx,(sexp)0x0,2,x,local_38);
  local_38 = ctx_00;
  if ((((ulong)ctx_00 & 3) != 0) || (ctx_00->tag != 0x13)) {
    ctx_00 = sexp_make_child_context(ctx,(((ctx->value).opcode.methods)->value).type.getters);
  }
  if (((((ulong)ctx_00 & 3) != 0) || (ctx_00->tag != 0x13)) &&
     ((psVar1 = (((ctx->value).opcode.methods)->value).type.dl, ((ulong)psVar1 & 3) != 0 ||
      (psVar1->tag != 0x13)))) {
    ctx_00 = sexp_apply(ctx_00,(op->value).type.name,local_38);
  }
  psVar1 = (local_38->value).type.name;
  if ((((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 6)) &&
      (psVar1 = (psVar1->value).type.slots, psVar1 != (sexp)0x0)) && (((ulong)ctx_00 & 3) == 0)) {
    if (ctx_00->tag == 6) {
      lVar2 = 0x18;
    }
    else {
      if ((ctx_00->tag != 0x13) || ((x->value).type.setters != (sexp)0x3e)) goto LAB_0012c725;
      lVar2 = 0x28;
    }
    *(sexp *)((long)&ctx_00->tag + lVar2) = psVar1;
  }
LAB_0012c725:
  (ctx->value).context.saves = local_30.next;
  return ctx_00;
}

Assistant:

static sexp analyze_macro_once (sexp ctx, sexp x, sexp op, int depth) {
  sexp res;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  tmp = sexp_cons(ctx, sexp_macro_env(op), SEXP_NULL);
  tmp = sexp_cons(ctx, sexp_context_env(ctx), tmp);
  tmp = sexp_cons(ctx, x, tmp);
  res = sexp_exceptionp(tmp) ? tmp : sexp_make_child_context(ctx, sexp_context_lambda(ctx));
  if (!sexp_exceptionp(res) && !sexp_exceptionp(sexp_context_exception(ctx)))
    res = sexp_apply(res, sexp_macro_proc(op), tmp);
  if (sexp_pairp(sexp_car(tmp)) && sexp_pair_source(sexp_car(tmp))) {
    if (sexp_pairp(res))
      sexp_pair_source(res) = sexp_pair_source(sexp_car(tmp));
    else if (sexp_exceptionp(res) && sexp_not(sexp_exception_source(x)))
      sexp_exception_source(res) = sexp_pair_source(sexp_car(tmp));
  }
  sexp_gc_release1(ctx);
  return res;
}